

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O3

void __thiscall fineftp::FtpSession::handleFtpCommandCDUP(FtpSession *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  int iVar3;
  FtpMessage cwd_reply;
  undefined1 local_58 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  string local_30;
  
  peVar2 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar2 == (element_type *)0x0) {
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Not logged in","");
    sendFtpMessage(this,NOT_LOGGED_IN,(string *)local_58);
  }
  else if ((peVar2->permissions_ & DirList) == None) {
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"Permission denied","");
    sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_58);
  }
  else {
    iVar3 = ::std::__cxx11::string::compare((char *)&this->ftp_working_directory_);
    if (iVar3 != 0) {
      paVar1 = &local_30.field_2;
      local_30._M_dataplus._M_p = (pointer)paVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"..","");
      executeCWD((FtpMessage *)local_58,this,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != paVar1) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      if (local_58._0_4_ == FILE_ACTION_COMPLETED) {
        local_30._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_30,local_58._8_8_,(char *)(local_58._8_8_ + local_58._16_8_));
        sendFtpMessage(this,COMMAND_OK,&local_30);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_30._M_dataplus._M_p != paVar1) {
          operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        sendFtpMessage(this,(FtpMessage *)local_58);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._8_8_ == &local_40) {
        return;
      }
      goto LAB_00115d83;
    }
    local_58._0_8_ = local_58 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_58,"Already at root directory","");
    sendFtpMessage(this,ACTION_NOT_TAKEN,(string *)local_58);
  }
  local_40._M_allocated_capacity = local_58._16_8_;
  local_58._8_8_ = local_58._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(local_58 + 0x10)) {
    return;
  }
LAB_00115d83:
  operator_delete((void *)local_58._8_8_,local_40._M_allocated_capacity + 1);
  return;
}

Assistant:

void FtpSession::handleFtpCommandCDUP(const std::string& /*param*/)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0) 
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    if (ftp_working_directory_ != "/")
    {
      // Only CDUP when we are not already at the root directory
      auto cwd_reply = executeCWD("..");
      if (cwd_reply.replyCode() == FtpReplyCode::FILE_ACTION_COMPLETED)
      {
        // The CWD returns FILE_ACTION_COMPLETED on success, while CDUP returns COMMAND_OK on success.
        sendFtpMessage(FtpReplyCode::COMMAND_OK, cwd_reply.message());
        return;
      }
      else
      {
        sendFtpMessage(cwd_reply);
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::ACTION_NOT_TAKEN, "Already at root directory");
      return;
    }
  }